

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O1

void __thiscall
libtorrent::torrent_info::set_web_seeds
          (torrent_info *this,
          vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_> *seeds)

{
  ::std::vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>::
  _M_move_assign(&this->m_web_seeds);
  return;
}

Assistant:

void torrent_info::set_web_seeds(std::vector<web_seed_entry> seeds)
	{
		m_web_seeds = std::move(seeds);
	}